

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O0

void rf_draw_poly(rf_vec2 center,int sides,float radius,float rotation,rf_color color)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  undefined8 local_30;
  rf_int i;
  float centralAngle;
  float rotation_local;
  float radius_local;
  int sides_local;
  rf_color color_local;
  rf_vec2 center_local;
  
  rotation_local = (float)sides;
  if (sides < 3) {
    rotation_local = 4.2039e-45;
  }
  i._4_4_ = 0.0;
  _Var1 = rf_gfx_check_buffer_limit((int)(0x168 / (long)(int)rotation_local) << 2);
  if (_Var1) {
    rf_gfx_draw();
  }
  rf_gfx_push_matrix();
  sides_local = (int)center.x;
  color_local = (rf_color)center.y;
  rf_gfx_translatef((float)sides_local,(float)color_local,0.0);
  rf_gfx_rotatef(rotation,0.0,0.0,1.0);
  rf_gfx_begin(RF_TRIANGLES);
  for (local_30 = 0; local_30 < (int)rotation_local; local_30 = local_30 + 1) {
    radius_local._0_1_ = color.r;
    radius_local._1_1_ = color.g;
    radius_local._2_1_ = color.b;
    radius_local._3_1_ = color.a;
    rf_gfx_color4ub(radius_local._0_1_,radius_local._1_1_,radius_local._2_1_,radius_local._3_1_);
    rf_gfx_vertex2f(0.0,0.0);
    fVar2 = sinf(i._4_4_ * 0.017453292);
    fVar3 = cosf(i._4_4_ * 0.017453292);
    rf_gfx_vertex2f(fVar2 * radius,fVar3 * radius);
    i._4_4_ = 360.0 / (float)(int)rotation_local + i._4_4_;
    fVar2 = sinf(i._4_4_ * 0.017453292);
    fVar3 = cosf(i._4_4_ * 0.017453292);
    rf_gfx_vertex2f(fVar2 * radius,fVar3 * radius);
  }
  rf_gfx_end();
  rf_gfx_pop_matrix();
  return;
}

Assistant:

RF_API void rf_draw_poly(rf_vec2 center, int sides, float radius, float rotation, rf_color color)
{
    if (sides < 3) sides = 3;
    float centralAngle = 0.0f;

    if (rf_gfx_check_buffer_limit(4 * (360/sides))) rf_gfx_draw();

    rf_gfx_push_matrix();
    rf_gfx_translatef(center.x, center.y, 0.0f);
    rf_gfx_rotatef(rotation, 0.0f, 0.0f, 1.0f);
    rf_gfx_begin(RF_TRIANGLES);
    for (rf_int i = 0; i < sides; i++)
    {
        rf_gfx_color4ub(color.r, color.g, color.b, color.a);

        rf_gfx_vertex2f(0, 0);
        rf_gfx_vertex2f(sinf(RF_DEG2RAD*centralAngle)*radius, cosf(RF_DEG2RAD*centralAngle)*radius);

        centralAngle += 360.0f/(float)sides;
        rf_gfx_vertex2f(sinf(RF_DEG2RAD*centralAngle)*radius, cosf(RF_DEG2RAD*centralAngle)*radius);
    }
    rf_gfx_end();

    rf_gfx_pop_matrix();
}